

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Block.h
# Opt level: O0

void __thiscall
Eigen::Block<const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_-1,_1,_false>::Block
          (Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_false> *this,
          Matrix<float,__1,__1,_0,__1,__1> *xpr,Index startRow,Index startCol,Index blockRows,
          Index blockCols)

{
  bool bVar1;
  Index IVar2;
  Index blockCols_local;
  Index blockRows_local;
  Index startCol_local;
  Index startRow_local;
  Matrix<float,__1,__1,_0,__1,__1> *xpr_local;
  Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_false> *this_local;
  
  BlockImpl<const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_-1,_1,_false,_Eigen::Dense>::BlockImpl
            (&this->
              super_BlockImpl<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_false,_Eigen::Dense>
             ,xpr,startRow,startCol,blockRows,blockCols);
  if (blockCols != 1) {
    __assert_fail("(RowsAtCompileTime==Dynamic || RowsAtCompileTime==blockRows) && (ColsAtCompileTime==Dynamic || ColsAtCompileTime==blockCols)"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/Core/Block.h"
                  ,0x91,
                  "Eigen::Block<const Eigen::Matrix<float, -1, -1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = const Eigen::Matrix<float, -1, -1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
                 );
  }
  bVar1 = false;
  if ((-1 < startRow) && (bVar1 = false, -1 < blockRows)) {
    IVar2 = PlainObjectBase<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>::rows
                      (&xpr->super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>);
    bVar1 = false;
    if ((startRow <= IVar2 - blockRows) && (bVar1 = false, -1 < startCol)) {
      IVar2 = PlainObjectBase<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>::cols
                        (&xpr->super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>);
      bVar1 = startCol <= IVar2 + -1;
    }
  }
  if (bVar1) {
    return;
  }
  __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/Core/Block.h"
                ,0x93,
                "Eigen::Block<const Eigen::Matrix<float, -1, -1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = const Eigen::Matrix<float, -1, -1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
               );
}

Assistant:

Block(XprType& xpr,
          Index startRow, Index startCol,
          Index blockRows, Index blockCols)
      : Impl(xpr, startRow, startCol, blockRows, blockCols)
    {
      eigen_assert((RowsAtCompileTime==Dynamic || RowsAtCompileTime==blockRows)
          && (ColsAtCompileTime==Dynamic || ColsAtCompileTime==blockCols));
      eigen_assert(startRow >= 0 && blockRows >= 0 && startRow  <= xpr.rows() - blockRows
          && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols);
    }